

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  anon_class_24_3_e601bc94 f;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_t hash;
  undefined8 uVar6;
  uint64_t v;
  size_t sVar7;
  ctrl_t cVar8;
  ulong uVar9;
  FindInfo FVar10;
  HashSetResizeHelper resize_helper;
  undefined1 local_82;
  undefined1 local_81;
  HeapOrSoo local_80;
  size_t local_70;
  byte local_68;
  undefined2 local_67;
  void *local_60;
  MaybeInitializedPtr local_58;
  void *local_50;
  CommonFields *local_48;
  void **ppvStack_40;
  MaybeInitializedPtr *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_70 = common->capacity_;
    local_68 = (byte)common->size_ & 1;
    local_67 = 0;
    local_80.heap.control = (common->heap_or_soo_).heap.control;
    local_80.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,96ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_80,common,&local_81,0xffffff80,0x20,0x60);
    if (local_70 != 0) {
      if (bVar3) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,void>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
                  ((HashSetResizeHelper *)&local_80.heap,common,
                   (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>
                    *)common);
      }
      else {
        if ((char)local_67 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_70 != 0) {
          local_60 = (common->heap_or_soo_).heap.slot_array.p;
          sVar7 = 0;
          uVar6 = local_80.heap.slot_array;
          do {
            if ((char)local_67 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_80.heap.control[sVar7]) {
              uVar1 = *(ulong *)(uVar6 + 8);
              uVar4 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,*(undefined8 *)uVar6,uVar1);
              uVar9 = (uVar4 ^ uVar1) * -0x234dd359734ecb13;
              FVar10 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                                   (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                                   (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                                   (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38),hash);
              uVar5 = FVar10.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar5) {
                __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x744,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar8 = (ctrl_t)(uVar9 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar5] = cVar8;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar5 - 0xf & uVar1)] = cVar8;
              local_50 = (void *)(uVar5 * 0x60 + (long)local_60);
              ppvStack_40 = &local_50;
              f.to = (slot_type **)ppvStack_40;
              f.this = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
                        *)common;
              f.from = (slot_type **)&local_58;
              local_58 = (MaybeInitializedPtr)uVar6;
              local_48 = common;
              local_38 = &local_58;
              CommonFields::
              RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::transfer(absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>*,absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>*)::_lambda()_1_>
                        (common,f);
            }
            sVar7 = sVar7 + 1;
            uVar6 = uVar6 + 0x60;
          } while (sVar7 != local_70);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_80,&local_82,0x60);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }